

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int io_close(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  
  pTVar1 = L->base;
  if (((pTVar1 == &luaO_nilobject_) || (L->top <= pTVar1)) || (pTVar1->tt == -1)) {
    lua_rawgeti(L,-0x2711,2);
  }
  tofile(L);
  iVar2 = aux_close(L);
  return iVar2;
}

Assistant:

static int io_close(lua_State*L){
if(lua_isnone(L,1))
lua_rawgeti(L,(-10001),2);
tofile(L);
return aux_close(L);
}